

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O0

void __thiscall xmrig::Hashrate::~Hashrate(Hashrate *this)

{
  void *pvVar1;
  ulong *in_RDI;
  size_t i;
  ulong local_10;
  
  for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
    pvVar1 = *(void **)(in_RDI[2] + local_10 * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    pvVar1 = *(void **)(in_RDI[3] + local_10 * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
  }
  if ((void *)in_RDI[2] != (void *)0x0) {
    operator_delete__((void *)in_RDI[2]);
  }
  if ((void *)in_RDI[3] != (void *)0x0) {
    operator_delete__((void *)in_RDI[3]);
  }
  if ((void *)in_RDI[1] != (void *)0x0) {
    operator_delete__((void *)in_RDI[1]);
  }
  return;
}

Assistant:

xmrig::Hashrate::~Hashrate()
{
    for (size_t i = 0; i < m_threads; i++) {
        delete [] m_counts[i];
        delete [] m_timestamps[i];
    }

    delete [] m_counts;
    delete [] m_timestamps;
    delete [] m_top;
}